

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_queue_make_later_events_active(event_base *base)

{
  event_callback *peVar1;
  int iVar2;
  event_callback *evcb;
  event_base *base_local;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar2 = evthread_is_debug_lock_held_(base->th_base_lock), iVar2 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xd75,"evthread_is_debug_lock_held_((base)->th_base_lock)",
               "event_queue_make_later_events_active");
  }
  while( true ) {
    peVar1 = (base->active_later_queue).tqh_first;
    if (peVar1 == (event_callback *)0x0) {
      return;
    }
    if ((peVar1->evcb_active_next).tqe_next == (event_callback *)0x0) {
      (base->active_later_queue).tqh_last = (peVar1->evcb_active_next).tqe_prev;
    }
    else {
      (((peVar1->evcb_active_next).tqe_next)->evcb_active_next).tqe_prev =
           (peVar1->evcb_active_next).tqe_prev;
    }
    *(peVar1->evcb_active_next).tqe_prev = (peVar1->evcb_active_next).tqe_next;
    peVar1->evcb_flags = peVar1->evcb_flags & 0xffdfU | 8;
    if (base->nactivequeues <= (int)(uint)peVar1->evcb_pri) break;
    (peVar1->evcb_active_next).tqe_next = (event_callback *)0x0;
    (peVar1->evcb_active_next).tqe_prev = base->activequeues[peVar1->evcb_pri].tqh_last;
    *base->activequeues[peVar1->evcb_pri].tqh_last = peVar1;
    base->activequeues[peVar1->evcb_pri].tqh_last = (event_callback **)peVar1;
    base->n_deferreds_queued = (uint)(peVar1->evcb_closure == '\x03') + base->n_deferreds_queued;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
             ,0xd7a,"evcb->evcb_pri < base->nactivequeues","event_queue_make_later_events_active");
}

Assistant:

static void
event_queue_make_later_events_active(struct event_base *base)
{
	struct event_callback *evcb;
	EVENT_BASE_ASSERT_LOCKED(base);

	while ((evcb = TAILQ_FIRST(&base->active_later_queue))) {
		TAILQ_REMOVE(&base->active_later_queue, evcb, evcb_active_next);
		evcb->evcb_flags = (evcb->evcb_flags & ~EVLIST_ACTIVE_LATER) | EVLIST_ACTIVE;
		EVUTIL_ASSERT(evcb->evcb_pri < base->nactivequeues);
		TAILQ_INSERT_TAIL(&base->activequeues[evcb->evcb_pri], evcb, evcb_active_next);
		base->n_deferreds_queued += (evcb->evcb_closure == EV_CLOSURE_CB_SELF);
	}
}